

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_float.h
# Opt level: O0

void duckdb_fast_float::detail::decimal_right_shift(decimal *h,uint32_t shift)

{
  uint8_t uVar1;
  ulong uVar2;
  ulong uVar3;
  byte in_SIL;
  decimal *in_RDI;
  uint8_t new_digit_1;
  uint8_t new_digit;
  uint64_t mask;
  uint64_t n;
  uint32_t write_index;
  uint32_t read_index;
  ulong local_20;
  uint local_14;
  uint local_10;
  
  local_10 = 0;
  local_14 = 0;
  local_20 = 0;
  while( true ) {
    if (local_20 >> (in_SIL & 0x3f) != 0) goto LAB_0033dc7e;
    if (in_RDI->num_digits <= local_10) break;
    local_20 = local_20 * 10 + (ulong)in_RDI->digits[local_10];
    local_10 = local_10 + 1;
  }
  if (local_20 == 0) {
    return;
  }
  for (; local_20 >> (in_SIL & 0x3f) == 0; local_20 = local_20 * 10) {
    local_10 = local_10 + 1;
  }
LAB_0033dc7e:
  in_RDI->decimal_point = in_RDI->decimal_point - (local_10 - 1);
  if (in_RDI->decimal_point < -0x7ff) {
    in_RDI->num_digits = 0;
    in_RDI->decimal_point = 0;
    in_RDI->negative = false;
    in_RDI->truncated = false;
  }
  else {
    uVar2 = (1L << (in_SIL & 0x3f)) - 1;
    while (local_10 < in_RDI->num_digits) {
      uVar3 = local_20 >> (in_SIL & 0x3f);
      local_20 = (local_20 & uVar2) * 10 + (ulong)in_RDI->digits[local_10];
      in_RDI->digits[local_14] = (uint8_t)uVar3;
      local_14 = local_14 + 1;
      local_10 = local_10 + 1;
    }
    while (local_20 != 0) {
      uVar1 = (uint8_t)(local_20 >> (in_SIL & 0x3f));
      local_20 = (local_20 & uVar2) * 10;
      if (local_14 < 0x300) {
        in_RDI->digits[local_14] = uVar1;
        local_14 = local_14 + 1;
      }
      else if (uVar1 != '\0') {
        in_RDI->truncated = true;
      }
    }
    in_RDI->num_digits = local_14;
    trim(in_RDI);
  }
  return;
}

Assistant:

inline void decimal_right_shift(decimal &h, uint32_t shift) {
  uint32_t read_index = 0;
  uint32_t write_index = 0;

  uint64_t n = 0;

  while ((n >> shift) == 0) {
    if (read_index < h.num_digits) {
      n = (10 * n) + h.digits[read_index++];
    } else if (n == 0) {
      return;
    } else {
      while ((n >> shift) == 0) {
        n = 10 * n;
        read_index++;
      }
      break;
    }
  }
  h.decimal_point -= int32_t(read_index - 1);
  if (h.decimal_point < -decimal_point_range) { // it is zero
    h.num_digits = 0;
    h.decimal_point = 0;
    h.negative = false;
    h.truncated = false;
    return;
  }
  uint64_t mask = (uint64_t(1) << shift) - 1;
  while (read_index < h.num_digits) {
    uint8_t new_digit = uint8_t(n >> shift);
    n = (10 * (n & mask)) + h.digits[read_index++];
    h.digits[write_index++] = new_digit;
  }
  while (n > 0) {
    uint8_t new_digit = uint8_t(n >> shift);
    n = 10 * (n & mask);
    if (write_index < max_digits) {
      h.digits[write_index++] = new_digit;
    } else if (new_digit > 0) {
      h.truncated = true;
    }
  }
  h.num_digits = write_index;
  trim(h);
}